

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  glslopt_target target;
  bool bVar1;
  int iVar2;
  glslopt_ctx *ctx;
  size_t sVar3;
  char *pcVar4;
  FILE *pFVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  glslopt_shader *shader;
  char *pcVar9;
  byte bVar10;
  ulong uVar11;
  char *pcVar12;
  int local_38;
  
  if (argc < 3) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar12 = (char *)0x0;
    uVar11 = 1;
    target = kGlslTargetOpenGL;
    bVar10 = 0;
    pcVar4 = (char *)0x0;
    do {
      pcVar8 = argv[uVar11];
      pcVar9 = pcVar4;
      if (*pcVar8 == '-') {
        iVar2 = strcmp("-v",pcVar8);
        if (iVar2 == 0) {
          bVar10 = 1;
        }
        else {
          iVar2 = strcmp("-f",pcVar8);
          if (iVar2 == 0) {
            bVar10 = 0;
          }
          else {
            iVar2 = strcmp("-1",pcVar8);
            if (iVar2 == 0) {
              target = kGlslTargetOpenGL;
            }
            else {
              iVar2 = strcmp("-2",pcVar8);
              if (iVar2 == 0) {
                target = kGlslTargetOpenGLES20;
              }
              else {
                iVar2 = strcmp("-3",pcVar8);
                if (iVar2 == 0) {
                  target = kGlslTargetOpenGLES30;
                }
              }
            }
          }
        }
      }
      else {
        pcVar9 = pcVar8;
        if ((pcVar4 != (char *)0x0) && (pcVar9 = pcVar4, pcVar12 == (char *)0x0)) {
          pcVar12 = pcVar8;
        }
      }
      uVar11 = uVar11 + 1;
      pcVar4 = pcVar9;
    } while ((uint)argc != uVar11);
    if (pcVar9 != (char *)0x0) {
      ctx = glslopt_initialize(target);
      if (ctx == (glslopt_ctx *)0x0) {
        puts("Failed to initialize glslopt!");
        return 1;
      }
      pcVar4 = pcVar12;
      if (pcVar12 == (char *)0x0) {
        sVar3 = strlen(pcVar9);
        pcVar4 = (char *)calloc(sVar3 + 5,1);
        snprintf(pcVar4,sVar3 + 5,"%s.out");
      }
      pFVar5 = fopen(pcVar9,"rt");
      if (pFVar5 == (FILE *)0x0) {
        pcVar8 = (char *)0x0;
        printf("Failed to open %s for reading\n",pcVar9);
      }
      else {
        fseek(pFVar5,0,2);
        lVar6 = ftell(pFVar5);
        fseek(pFVar5,0,0);
        uVar7 = (ulong)((int)lVar6 + 1);
        uVar11 = 0xffffffffffffffff;
        if (-1 < (long)uVar7) {
          uVar11 = uVar7;
        }
        pcVar8 = (char *)operator_new__(uVar11);
        sVar3 = fread(pcVar8,1,(long)(int)lVar6,pFVar5);
        pcVar8[(int)sVar3] = '\0';
        fclose(pFVar5);
      }
      if (pcVar8 == (char *)0x0) {
        bVar10 = 0;
      }
      else {
        shader = glslopt_optimize(ctx,(uint)(~bVar10 & 1),pcVar8,0);
        bVar1 = glslopt_get_status(shader);
        if (bVar1) {
          pcVar9 = glslopt_get_output(shader);
          sVar3 = strlen(pcVar9);
          pFVar5 = fopen(pcVar4,"wt");
          if (pFVar5 == (FILE *)0x0) {
            bVar10 = 0;
            printf("Failed to open %s for writing\n",pcVar4);
          }
          else {
            local_38 = (int)sVar3;
            sVar3 = fwrite(pcVar9,(long)local_38,1,pFVar5);
            if (sVar3 == 1) {
              fclose(pFVar5);
              bVar10 = 1;
            }
            else {
              bVar10 = 0;
              printf("Failed to write to %s\n",pcVar4);
              fclose(pFVar5);
            }
          }
          if (bVar10 != 0) {
            operator_delete__(pcVar8);
          }
        }
        else {
          pcVar8 = glslopt_get_log(shader);
          bVar10 = 0;
          printf("Failed to compile %s:\n\n%s\n",pcVar9,pcVar8);
        }
      }
      if (pcVar12 == (char *)0x0) {
        free(pcVar4);
      }
      glslopt_cleanup(ctx);
      return (uint)(bVar10 ^ 1);
    }
    pcVar4 = "Must give a source";
  }
  printhelp(pcVar4);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
	if( argc < 3 )
		return printhelp(NULL);

	bool vertexShader = false, freename = false;
	glslopt_target languageTarget = kGlslTargetOpenGL;
	const char* source = 0;
	char* dest = 0;

	for( int i=1; i < argc; i++ )
	{
		if( argv[i][0] == '-' )
		{
			if( 0 == strcmp("-v", argv[i]) )
				vertexShader = true;
			else if( 0 == strcmp("-f", argv[i]) )
				vertexShader = false;
			else if( 0 == strcmp("-1", argv[i]) )
				languageTarget = kGlslTargetOpenGL;
			else if( 0 == strcmp("-2", argv[i]) )
				languageTarget = kGlslTargetOpenGLES20;
			else if( 0 == strcmp("-3", argv[i]) )
				languageTarget = kGlslTargetOpenGLES30;
		}
		else
		{
			if( source == 0 )
				source = argv[i];
			else if( dest == 0 )
				dest = argv[i];
		}
	}

	if( !source )
		return printhelp("Must give a source");

	if( !init(languageTarget) )
	{
		printf("Failed to initialize glslopt!\n");
		return 1;
	}

	if ( !dest ) {
		dest = (char *) calloc(strlen(source)+5, sizeof(char));
		snprintf(dest, strlen(source)+5, "%s.out", source);
		freename = true;
	}

	int result = 0;
	if( !compileShader(dest, source, vertexShader) )
		result = 1;

	if( freename ) free(dest);

	term();
	return result;
}